

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpu.cpp
# Opt level: O0

int __thiscall geemuboi::core::CPU::call_nz_a16(CPU *this)

{
  ushort uVar1;
  Registers *pRVar2;
  int iVar3;
  uint uVar4;
  CPU *this_local;
  
  if ((this->regs->f & 0x80) == 0) {
    (*this->mmu->_vptr_IMmu[3])
              (this->mmu,(ulong)(ushort)(this->regs->sp - 2),(ulong)(ushort)(this->regs->pc + 2));
    pRVar2 = this->regs;
    uVar4 = pRVar2->sp - 2;
    pRVar2->sp = (uint16_t)uVar4;
    uVar1 = this->regs->pc;
    iVar3 = (*this->mmu->_vptr_IMmu[1])
                      (this->mmu,(ulong)uVar1,(ulong)uVar4,
                       CONCAT62((int6)((ulong)pRVar2 >> 0x10),uVar1));
    this->regs->pc = (uint16_t)iVar3;
    this_local._4_4_ = 6;
  }
  else {
    this->regs->pc = this->regs->pc + 2;
    this_local._4_4_ = 3;
  }
  return this_local._4_4_;
}

Assistant:

int CPU::call_nz_a16() {
    if (!(regs.f & 0x80)) {
        mmu.write_word(regs.sp - 2, regs.pc + 2);
        regs.sp -= 2;
        regs.pc = mmu.read_word(regs.pc);
        return 6;
    } else {
        regs.pc += 2;
        return 3;
    }
}